

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O3

int YPSpur_md_set_pos(YPSpur *spur,int cs,double x,double y,double theta)

{
  int iVar1;
  int iVar2;
  YPSpur_msg msg;
  YPSpur_msg local_40;
  
  local_40.msg_type = 1;
  local_40.pid = (long)spur->pid;
  local_40.type = 0x54;
  local_40.cs = cs;
  local_40.data[0] = x;
  local_40.data[1] = y;
  local_40.data[2] = theta;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_40);
  iVar2 = 1;
  if (iVar1 < 0) {
    spur->connection_error = 1;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int YPSpur_md_set_pos(YPSpur* spur, int cs, double x, double y, double theta)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_SET_POS;
  msg.data[0] = x;
  msg.data[1] = y;
  msg.data[2] = theta;
  msg.cs = cs;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }
  return 1;
}